

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

Integer pnga_pgroup_duplicate(Integer grp)

{
  proc_list_t *ppVar1;
  size_t __n;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  int iVar7;
  Integer IVar8;
  int *piVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  proc_list_t *ppVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  if ((grp != -1) && (PGRP_LIST[grp].actv == 0)) {
    pnga_error(" Group is not active ",grp);
  }
  piVar9 = &PGRP_LIST->actv;
  uVar11 = 0xffffffffffffffff;
  do {
    iVar2 = *piVar9;
    uVar12 = uVar11 + 1;
    if (iVar2 == 0) break;
    lVar13 = uVar11 + 2;
    piVar9 = piVar9 + 10;
    uVar11 = uVar12;
  } while (lVar13 < _max_global_array);
  uVar12 = -(ulong)(iVar2 != 0) | uVar12;
  if (iVar2 != 0) {
    pnga_error(" Too many process groups ",(long)_max_global_array);
  }
  IVar8 = GAnproc;
  ppVar14 = PGRP_LIST;
  piVar9 = (int *)malloc(GAnproc * 8);
  ppVar14[uVar12].map_proc_list = piVar9;
  __n = IVar8 * 4;
  PGRP_LIST[uVar12].inv_map_proc_list = PGRP_LIST[uVar12].map_proc_list + IVar8;
  ppVar14 = PGRP_LIST;
  if (0 < IVar8) {
    memset(PGRP_LIST[uVar12].map_proc_list,0xff,__n);
    ppVar14 = PGRP_LIST;
    memset(PGRP_LIST[uVar12].inv_map_proc_list,0xff,__n);
    if (grp == -1) {
      piVar9 = ppVar14[uVar12].map_proc_list;
      piVar10 = ppVar14[uVar12].inv_map_proc_list;
      lVar13 = 0;
      do {
        piVar9[lVar13] = (int)lVar13;
        piVar10[lVar13] = (int)lVar13;
        lVar13 = lVar13 + 1;
      } while (IVar8 != lVar13);
    }
    else {
      piVar9 = ppVar14[grp].map_proc_list;
      piVar10 = ppVar14[grp].inv_map_proc_list;
      piVar4 = ppVar14[uVar12].map_proc_list;
      piVar5 = ppVar14[uVar12].inv_map_proc_list;
      lVar13 = 0;
      do {
        piVar4[lVar13] = piVar9[lVar13];
        piVar5[lVar13] = piVar10[lVar13];
        lVar13 = lVar13 + 1;
      } while (IVar8 != lVar13);
    }
  }
  iVar2 = ppVar14[grp].map_nproc;
  piVar10 = (int *)malloc(__n);
  iVar7 = GA_Default_Proc_Group;
  auVar6 = _DAT_001b1810;
  piVar9 = ppVar14[grp].inv_map_proc_list;
  iVar3 = ppVar14[grp].parent;
  GA_Default_Proc_Group = iVar3;
  if ((grp == -1) || (iVar3 == -1)) {
    if ((grp == -1) || (iVar3 != -1)) {
      if (0 < IVar8) {
        lVar13 = IVar8 + -1;
        auVar15._8_4_ = (int)lVar13;
        auVar15._0_8_ = lVar13;
        auVar15._12_4_ = (int)((ulong)lVar13 >> 0x20);
        uVar11 = 0;
        auVar15 = auVar15 ^ _DAT_001b1810;
        auVar16 = _DAT_001b1830;
        do {
          auVar17 = auVar16 ^ auVar6;
          if ((bool)(~(auVar17._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar17._0_4_ ||
                      auVar15._4_4_ < auVar17._4_4_) & 1)) {
            piVar10[uVar11] = (int)uVar11;
          }
          if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
              auVar17._12_4_ <= auVar15._12_4_) {
            piVar10[uVar11 + 1] = (int)uVar11 + 1;
          }
          uVar11 = uVar11 + 2;
          lVar13 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 2;
          auVar16._8_8_ = lVar13 + 2;
        } while ((IVar8 + 1U & 0xfffffffffffffffe) != uVar11);
      }
    }
    else if (0 < iVar2) {
      piVar4 = ppVar14[grp].map_proc_list;
      lVar13 = 0;
      do {
        piVar10[lVar13] = piVar4[piVar9[lVar13]];
        lVar13 = lVar13 + 1;
      } while (iVar2 != lVar13);
    }
  }
  else if (0 < iVar2) {
    piVar4 = ppVar14[iVar3].map_proc_list;
    lVar13 = 0;
    do {
      piVar10[lVar13] = piVar4[piVar9[lVar13]];
      lVar13 = lVar13 + 1;
    } while (iVar2 != lVar13);
  }
  ppVar1 = ppVar14 + uVar12;
  ppVar1->map_nproc = iVar2;
  ppVar1->actv = 1;
  ppVar1->parent = iVar3;
  ppVar1->mirrored = 0;
  ppVar1->map_nproc = ppVar14[grp].map_nproc;
  ARMCI_Group_create(iVar2,piVar10,&ppVar1->group);
  GA_Default_Proc_Group = iVar7;
  free(piVar10);
  return uVar12;
}

Assistant:

Integer pnga_pgroup_duplicate(Integer grp)
{
    Integer pgrp_handle, i, j, nprocs, itmp;
    int tmp_count;
    int *tmp_list, *tmp2_list;
#ifdef MSG_COMMS_MPI
    ARMCI_Group *tmpgrp;
#endif
    Integer save_grp;
    if (grp != -1 && !PGRP_LIST[grp].actv) {
       pnga_error(" Group is not active ", grp);
    }

    /*** Get next free process group handle ***/
    pgrp_handle =-1; i=0;
    do{
       if(!PGRP_LIST[i].actv) pgrp_handle=i;
       i++;
    }while(i<_max_global_array && pgrp_handle==-1);
    if( pgrp_handle == -1)
       pnga_error(" Too many process groups ", (Integer)_max_global_array);
 
    /* Allocate memory for arrays containg processor maps and initialize
       values */
    PGRP_LIST[pgrp_handle].map_proc_list
       = (int*)malloc(GAnproc*sizeof(int)*2);
    PGRP_LIST[pgrp_handle].inv_map_proc_list
       = PGRP_LIST[pgrp_handle].map_proc_list + GAnproc;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].map_proc_list[i] = -1;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].inv_map_proc_list[i] = -1;
    if (grp != -1) {
      for (i=0; i<GAnproc; i++) {
        PGRP_LIST[pgrp_handle].map_proc_list[i]
          = PGRP_LIST[grp].map_proc_list[i];
        PGRP_LIST[pgrp_handle].inv_map_proc_list[i]
          = PGRP_LIST[grp].inv_map_proc_list[i];
      }
    } else {
      for (i=0; i<GAnproc; i++) {
        PGRP_LIST[pgrp_handle].map_proc_list[i]
          = i;
        PGRP_LIST[pgrp_handle].inv_map_proc_list[i]
          = i;
      }
    }
    tmp_count = PGRP_LIST[grp].map_nproc;

    tmp_list = (int*)malloc(GAnproc*sizeof(int));
    tmp2_list = PGRP_LIST[grp].inv_map_proc_list;
    save_grp = GA_Default_Proc_Group;
    GA_Default_Proc_Group = PGRP_LIST[grp].parent;
    if (grp != -1 && GA_Default_Proc_Group != -1) {
       int parent = GA_Default_Proc_Group;
       for (i=0; i<tmp_count; i++) {
          tmp_list[i] = (int)PGRP_LIST[parent].map_proc_list[tmp2_list[i]];
       }
    } else if (grp != -1 && GA_Default_Proc_Group == -1) {
       for (i=0; i<tmp_count; i++) {
          tmp_list[i] = (int)PGRP_LIST[grp].map_proc_list[tmp2_list[i]];
       }
    } else {
       for (i=0; i<GAnproc; i++) {
          tmp_list[i] = i;
       }
    }
    
    PGRP_LIST[pgrp_handle].map_nproc = tmp_count;
    PGRP_LIST[pgrp_handle].actv = 1;
    PGRP_LIST[pgrp_handle].parent = PGRP_LIST[grp].parent;
    PGRP_LIST[pgrp_handle].mirrored = 0;
    PGRP_LIST[pgrp_handle].map_nproc = PGRP_LIST[grp].map_nproc;
#ifdef MSG_COMMS_MPI
    tmpgrp = &PGRP_LIST[pgrp_handle].group;
#if ENABLE_CHECKPOINT
    if(ga_group_is_for_ft)
       tmpgrp = ARMCI_Get_ft_group();
    else
#endif
       ARMCI_Group_create(tmp_count, tmp_list, &PGRP_LIST[pgrp_handle].group);
#endif

    GA_Default_Proc_Group = save_grp;
    /* Clean up temporary arrays */
    free(tmp_list);

#ifdef MSG_COMMS_MPI
    return pgrp_handle;
#else
    return pnga_pgroup_get_default();
#endif
}